

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  code *pcVar2;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  int *args_00;
  istream *bytestream;
  v8 *this;
  bool bVar4;
  exception *e;
  int local_584;
  int i;
  istream local_560 [8];
  ifstream fs;
  allocator<char> local_351;
  string local_350;
  undefined1 local_330 [8];
  int cycles;
  string rom;
  Nes nes;
  char **argv_local;
  int argc_local;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> **local_280;
  char *local_278;
  size_t local_270;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_268 [2];
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> **local_258;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *vargs;
  char *local_248;
  size_t sStack_240;
  format_args local_238;
  char *local_228;
  v8 *local_220;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_218 [2];
  value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_208;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char *local_1f8;
  v8 *pvStack_1f0;
  format_args local_1e8;
  char *local_1d8;
  size_t local_1d0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int> *local_1c8 [2];
  value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_1b8;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int> *vargs_2;
  char *local_1a8;
  size_t sStack_1a0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_const_char_*> *vargs_3;
  char **local_140;
  char *local_138;
  size_t sStack_130;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> **local_120;
  int *local_118;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> **local_110;
  undefined8 local_108;
  int *local_100;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> **local_f8;
  char **local_f0;
  char *local_e8;
  v8 *pvStack_e0;
  value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_d0;
  format_args *local_c8;
  value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_c0;
  value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_b8;
  undefined8 local_b0;
  format_args *local_a8;
  char **local_a0;
  char *local_98;
  size_t sStack_90;
  value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_80;
  format_args *local_78;
  value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_70;
  value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *local_68;
  undefined8 local_60;
  format_args *local_58;
  
  argv_local._4_4_ = 0;
  if (argc == 3) {
    n_e_s::nes::Nes::Nes((Nes *)((long)&rom.field_2 + 8));
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cycles,pcVar1,(allocator<char> *)(local_330 + 7));
    std::allocator<char>::~allocator((allocator<char> *)(local_330 + 7));
    pcVar1 = argv[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,pcVar1,&local_351);
    iVar3 = std::__cxx11::stoi(&local_350,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_350);
    std::allocator<char>::~allocator(&local_351);
    local_330._0_4_ = iVar3;
    std::ifstream::ifstream(local_560,(string *)&cycles,_S_bin);
    bytestream = local_560;
    n_e_s::nes::Nes::load_rom((Nes *)((long)&rom.field_2 + 8),bytestream);
    local_1f8 = "Running rom: \"{}\"\n";
    pvStack_1f0 = (v8 *)0x12;
    vargs_1 = (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&cycles;
    local_218[0] = fmt::v8::
                   make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,std::__cxx11::string_const&>
                             (vargs_1,(v8 *)bytestream,args);
    local_208 = (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)local_218;
    local_f0 = &local_1f8;
    local_228 = local_1f8;
    local_220 = pvStack_1f0;
    local_c8 = &local_238;
    local_b0 = 0xd;
    local_238.desc_ = 0xd;
    local_238.field_1.values_ = local_208;
    format_str_00.size_ = (size_t)pvStack_1f0;
    format_str_00.data_ = local_1f8;
    this = pvStack_1f0;
    local_e8 = local_228;
    pvStack_e0 = local_220;
    local_d0 = local_208;
    local_c0 = local_208;
    local_b8 = local_208;
    local_a8 = local_c8;
    fmt::v8::vprint(format_str_00,local_238);
    local_1a8 = "Cycles: \"{}\"\n";
    sStack_1a0 = 0xd;
    vargs_2 = (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_int> *)
              local_330;
    local_1c8[0] = fmt::v8::
                   make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,int_const&>
                             (vargs_2,this,args_00);
    local_1b8 = (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)local_1c8;
    local_a0 = &local_1a8;
    local_1d8 = local_1a8;
    local_1d0 = sStack_1a0;
    local_78 = &local_1e8;
    local_60 = 1;
    local_1e8.desc_ = 1;
    local_1e8.field_1.values_ = local_1b8;
    format_str_01.size_ = sStack_1a0;
    format_str_01.data_ = local_1a8;
    local_98 = local_1d8;
    sStack_90 = local_1d0;
    local_80 = local_1b8;
    local_70 = local_1b8;
    local_68 = local_1b8;
    local_58 = local_78;
    fmt::v8::vprint(format_str_01,local_1e8);
    local_584 = 0;
    while (local_584 < (int)local_330._0_4_) {
      n_e_s::nes::Nes::execute((Nes *)((long)&rom.field_2 + 8));
      bVar4 = SCARRY4(local_584,1);
      local_584 = local_584 + 1;
      if (bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
    }
    anon_unknown.dwarf_4bc8::print_nametable((Nes *)((long)&rom.field_2 + 8));
    std::ifstream::~ifstream(local_560);
    std::__cxx11::string::~string((string *)&cycles);
    n_e_s::nes::Nes::~Nes((Nes *)((long)&rom.field_2 + 8));
  }
  else {
    local_248 = "Expected two argument; <rom.nes> <cycles>\n";
    sStack_240 = 0x2a;
    vargs = _stderr;
    local_268[0] = fmt::v8::make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>>
                             ();
    local_258 = local_268;
    local_140 = &local_248;
    local_278 = local_248;
    local_270 = sStack_240;
    local_118 = &argc_local;
    local_108 = 0;
    _argc_local = 0;
    local_280 = local_258;
    format_str.size_ = sStack_240;
    format_str.data_ = local_248;
    local_138 = local_278;
    sStack_130 = local_270;
    local_120 = local_258;
    local_110 = local_258;
    local_100 = local_118;
    local_f8 = local_258;
    fmt::v8::vprint((FILE *)vargs,format_str,_argc_local);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) try {
    if (argc != 3) {
        fmt::print(stderr, "Expected two argument; <rom.nes> <cycles>\n");
        return 1;
    }

    n_e_s::nes::Nes nes;
    const std::string rom = argv[1];
    const int cycles = std::stoi(argv[2]);
    std::ifstream fs(rom, std::ios::binary);
    nes.load_rom(fs);

    fmt::print("Running rom: \"{}\"\n", rom);
    fmt::print("Cycles: \"{}\"\n", cycles);

    for (int i = 0; i < cycles; ++i) {
        nes.execute();
    }
    print_nametable(nes);
} catch (const std::exception &e) {
    fmt::print(stderr, "Exception: {}\n", e.what());
    return 1;
}